

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

iterator * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::InsertUnique(iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  void **ppvVar1;
  Node *pNVar2;
  bool bVar3;
  LogMessage *pLVar4;
  ulong uVar5;
  Node **ppNVar6;
  Node *pNVar7;
  LogFinisher local_79;
  LogMessage local_78;
  Node *local_38;
  InnerMap *pIStack_30;
  
  if ((this->index_of_first_non_null_ != this->num_buckets_) &&
     (this->table_[this->index_of_first_non_null_] == (void *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x326);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_78,
                        "CHECK failed: index_of_first_non_null_ == num_buckets_ || table_[index_of_first_non_null_] != nullptr: "
                       );
    internal::LogFinisher::operator=(&local_79,pLVar4);
    internal::LogMessage::~LogMessage(&local_78);
  }
  Map<std::__cxx11::string,CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::
  FindHelper<std::__cxx11::string>
            ((pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>::InnerMap::iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>,_unsigned_long>
              *)&local_78,this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)node,
             (TreeIterator *)0x0);
  if ((Node *)local_78._0_8_ != (Node *)0x0) {
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x32c);
    pLVar4 = internal::LogMessage::operator<<
                       (&local_78,"CHECK failed: find(node->kv.first) == end(): ");
    internal::LogFinisher::operator=(&local_79,pLVar4);
    internal::LogMessage::~LogMessage(&local_78);
  }
  ppvVar1 = this->table_;
  if (ppvVar1[b] == (void *)0x0) {
    node->next = (Node *)0x0;
    ppvVar1[b] = node;
    local_78._16_8_ = b;
    local_38 = node;
    pIStack_30 = this;
  }
  else {
    if (ppvVar1[b] == ppvVar1[b ^ 1]) {
      InsertUniqueInTree(__return_storage_ptr__,this,b,node);
      return __return_storage_ptr__;
    }
    bVar3 = TableEntryIsTooLong(this,b);
    if (!bVar3) {
      ppNVar6 = (Node **)(this->table_ + b);
      pNVar2 = *ppNVar6;
      if (pNVar2 == (Node *)0x0) {
        pNVar7 = (Node *)0x0;
      }
      else {
        pNVar7 = pNVar2;
        if (6 < (this->seed_ ^ (ulong)node) % 0xd) {
          pNVar7 = pNVar2->next;
          ppNVar6 = &pNVar2->next;
        }
      }
      node->next = pNVar7;
      *ppNVar6 = node;
      __return_storage_ptr__->node_ = node;
      __return_storage_ptr__->m_ = this;
      goto LAB_003213bc;
    }
    TreeConvert(this,b);
    InsertUniqueInTree((iterator *)&local_78,this,b,node);
    local_38 = (Node *)local_78._0_8_;
    pIStack_30 = (InnerMap *)local_78.filename_;
    if (local_78._16_8_ != (b & 0xfffffffffffffffe)) {
      internal::LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                 ,0x333);
      pLVar4 = internal::LogMessage::operator<<
                         (&local_78,
                          "CHECK failed: (result.bucket_index_) == (b & ~static_cast<size_type>(1)): "
                         );
      internal::LogFinisher::operator=(&local_79,pLVar4);
      internal::LogMessage::~LogMessage(&local_78);
    }
  }
  uVar5 = this->index_of_first_non_null_;
  if ((ulong)local_78._16_8_ < this->index_of_first_non_null_) {
    uVar5 = local_78._16_8_;
  }
  this->index_of_first_non_null_ = uVar5;
  __return_storage_ptr__->node_ = local_38;
  __return_storage_ptr__->m_ = pIStack_30;
  b = local_78._16_8_;
LAB_003213bc:
  __return_storage_ptr__->bucket_index_ = b;
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUnique(size_type b, Node* node) {
      GOOGLE_DCHECK(index_of_first_non_null_ == num_buckets_ ||
             table_[index_of_first_non_null_] != nullptr);
      // In practice, the code that led to this point may have already
      // determined whether we are inserting into an empty list, a short list,
      // or whatever.  But it's probably cheap enough to recompute that here;
      // it's likely that we're inserting into an empty or short list.
      iterator result;
      GOOGLE_DCHECK(find(node->kv.first) == end());
      if (TableEntryIsEmpty(b)) {
        result = InsertUniqueInList(b, node);
      } else if (TableEntryIsNonEmptyList(b)) {
        if (PROTOBUF_PREDICT_FALSE(TableEntryIsTooLong(b))) {
          TreeConvert(b);
          result = InsertUniqueInTree(b, node);
          GOOGLE_DCHECK_EQ(result.bucket_index_, b & ~static_cast<size_type>(1));
        } else {
          // Insert into a pre-existing list.  This case cannot modify
          // index_of_first_non_null_, so we skip the code to update it.
          return InsertUniqueInList(b, node);
        }
      } else {
        // Insert into a pre-existing tree.  This case cannot modify
        // index_of_first_non_null_, so we skip the code to update it.
        return InsertUniqueInTree(b, node);
      }
      // parentheses around (std::min) prevents macro expansion of min(...)
      index_of_first_non_null_ =
          (std::min)(index_of_first_non_null_, result.bucket_index_);
      return result;
    }